

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRectF * __thiscall
QWidgetEffectSourcePrivate::pixmap
          (QWidgetEffectSourcePrivate *this,CoordinateSystem system,QPoint *offset,
          PixmapPadMode mode)

{
  QPoint *pQVar1;
  QGraphicsEffect *pQVar2;
  long lVar3;
  QPoint *in_RCX;
  int in_EDX;
  QWidget *in_RSI;
  QRectF *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QPaintDevice *paintDevice;
  qreal dpr;
  QTransform *painterTransform;
  bool deviceCoordinates;
  QPixmap *pixmap;
  QRect effectRect;
  QRectF sourceRect;
  QPoint pixmapOffset;
  undefined4 in_stack_fffffffffffffe28;
  RenderFlag in_stack_fffffffffffffe2c;
  QWidget *in_stack_fffffffffffffe30;
  int line;
  QFlags<QWidget::RenderFlag> *this_00;
  QRectF *pQVar4;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffe57;
  undefined1 uVar6;
  double local_1a0;
  undefined8 in_stack_fffffffffffffe68;
  QFlagsStorage<QWidget::RenderFlag> renderFlags;
  QRegion local_160;
  QSize local_158;
  QSize local_150;
  char local_148 [32];
  QPoint local_128;
  QPoint local_120;
  undefined1 local_118 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  QRect local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  char local_38 [32];
  QColor local_18;
  long local_8;
  
  renderFlags.i = (Int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = in_RSI[3].data == (QWidgetData *)0x0 && in_EDX == 0;
  pQVar4 = in_RDI;
  if ((bool)uVar5) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    QMessageLogger::warning
              (local_38,"QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context"
              );
    QPixmap::QPixmap((QPixmap *)in_RDI);
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe30);
    local_60 = 0xffffffffffffffff;
    local_58 = 0xffffffffffffffff;
    local_50 = 0xffffffffffffffff;
    local_48 = 0xffffffffffffffff;
    local_70 = QWidget::rect(in_RSI);
    QRectF::QRectF(pQVar4,(QRect *)in_RDI);
    if (in_EDX == 0) {
      pQVar1 = (QPoint *)QPainter::worldTransform();
      QTransform::mapRect((QRectF *)&local_90);
      local_60 = local_90;
      local_58 = local_88;
      local_50 = local_80;
      local_48 = local_78;
      local_98 = (undefined1 *)QTransform::map(pQVar1);
      renderFlags.i = (Int)((ulong)pQVar1 >> 0x20);
      local_40 = local_98;
    }
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)in_stack_fffffffffffffe30);
    if (in_R8D == 2) {
      pQVar2 = QWidget::graphicsEffect(in_stack_fffffffffffffe30);
      (**(code **)(*(long *)pQVar2 + 0x60))(local_d8,pQVar2,&local_60);
      local_b8 = QRectF::toAlignedRect();
      local_a8 = local_b8;
    }
    else if (in_R8D == 1) {
      QRectF::adjusted((QRectF *)
                       CONCAT17(in_stack_fffffffffffffe57,CONCAT16(uVar5,in_stack_fffffffffffffe50))
                       ,(qreal)in_RSI,(qreal)pQVar4,(qreal)in_RDI,(qreal)in_stack_fffffffffffffe30);
      local_a8 = QRectF::toAlignedRect();
      local_e8 = local_a8;
    }
    else {
      local_a8 = QRectF::toAlignedRect();
      local_118 = local_a8;
    }
    if (in_RCX != (QPoint *)0x0) {
      local_120 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28));
      *in_RCX = local_120;
    }
    local_128 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ));
    QPoint::operator-=((QPoint *)in_stack_fffffffffffffe30,
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    line = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    local_1a0 = 1.0;
    lVar3 = QPainter::device();
    if (lVar3 == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)pQVar4,(char *)in_RDI,line,
                 (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      QMessageLogger::warning(local_148,"QWidgetEffectSourcePrivate::pixmap: Painter not active");
    }
    else {
      local_1a0 = (double)QPaintDevice::devicePixelRatio();
    }
    uVar6 = 0;
    *(undefined1 **)&in_RDI->xp = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&in_RDI->yp = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_158 = QRect::size((QRect *)pQVar4);
    local_150 = ::operator*((QSize *)pQVar4,(qreal)in_RDI);
    QPixmap::QPixmap((QPixmap *)in_RDI,(QSize *)&local_150);
    QPixmap::setDevicePixelRatio(local_1a0);
    QColor::QColor(&local_18,transparent);
    QPixmap::fill((QColor *)in_RDI);
    this_00 = *(QFlags<QWidget::RenderFlag> **)&in_RSI[3].field_0x18;
    QRegion::QRegion(&local_160);
    QFlags<QWidget::RenderFlag>::QFlags(this_00,in_stack_fffffffffffffe2c);
    QWidget::render((QWidget *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_fffffffffffffe50)),
                    (QPaintDevice *)in_RSI,(QPoint *)pQVar4,(QRegion *)in_RDI,
                    (RenderFlags)renderFlags.i);
    QRegion::~QRegion(&local_160);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QPixmap QWidgetEffectSourcePrivate::pixmap(Qt::CoordinateSystem system, QPoint *offset,
                                           QGraphicsEffect::PixmapPadMode mode) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (Q_UNLIKELY(!context && deviceCoordinates)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context");
        return QPixmap();
    }

    QPoint pixmapOffset;
    QRectF sourceRect = m_widget->rect();

    if (deviceCoordinates) {
        const QTransform &painterTransform = context->painter->worldTransform();
        sourceRect = painterTransform.mapRect(sourceRect);
        pixmapOffset = painterTransform.map(pixmapOffset);
    }

    QRect effectRect;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect)
        effectRect = m_widget->graphicsEffect()->boundingRectFor(sourceRect).toAlignedRect();
    else if (mode == QGraphicsEffect::PadToTransparentBorder)
        effectRect = sourceRect.adjusted(-1, -1, 1, 1).toAlignedRect();
    else
        effectRect = sourceRect.toAlignedRect();

    if (offset)
        *offset = effectRect.topLeft();

    pixmapOffset -= effectRect.topLeft();

    qreal dpr(1.0);
    if (const auto *paintDevice = context->painter->device())
        dpr = paintDevice->devicePixelRatio();
    else
        qWarning("QWidgetEffectSourcePrivate::pixmap: Painter not active");
    QPixmap pixmap(effectRect.size() * dpr);
    pixmap.setDevicePixelRatio(dpr);

    pixmap.fill(Qt::transparent);
    m_widget->render(&pixmap, pixmapOffset, QRegion(), QWidget::DrawChildren);
    return pixmap;
}